

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O0

boolean diseasemu(permonst *mdat)

{
  boolean bVar1;
  schar sVar2;
  int iVar3;
  char *cause;
  long local_20;
  permonst *mdat_local;
  
  if ((((u.uprops[0x34].intrinsic == 0) && ((youmonst.data)->mlet != ' ')) &&
      (youmonst.data != mons + 0xfd)) && (bVar1 = defends(0x21,uwep), bVar1 == '\0')) {
    if (u.uprops[0x1d].intrinsic == 0) {
      sVar2 = acurr(4);
      iVar3 = rn2((int)sVar2);
      local_20 = (long)(iVar3 + 0x14);
    }
    else {
      local_20 = (ulong)u.uprops[0x1d].intrinsic / 3 + 1;
    }
    cause = mons_mname(mdat);
    make_sick(local_20,cause,'\x01',2);
    return '\x01';
  }
  pline("You feel a slight illness.");
  return '\0';
}

Assistant:

static boolean diseasemu(const struct permonst *mdat)
{
	if (Sick_resistance) {
		pline("You feel a slight illness.");
		return FALSE;
	} else {
		make_sick(Sick ? Sick/3L + 1L : (long)rn1(ACURR(A_CON), 20),
			mons_mname(mdat), TRUE, SICK_NONVOMITABLE);
		return TRUE;
	}
}